

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O3

void __thiscall Party::Party(Party *this,World *world,Character *leader,Character *other)

{
  pointer *pppCVar1;
  iterator iVar2;
  Character *local_38;
  Character *local_30;
  Party *local_28;
  
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->world = world;
  local_38 = other;
  local_30 = leader;
  local_28 = this;
  std::vector<Party*,std::allocator<Party*>>::emplace_back<Party*>
            ((vector<Party*,std::allocator<Party*>> *)&world->parties,&local_28);
  iVar2._M_current =
       (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
              ((vector<Character*,std::allocator<Character*>> *)&this->members,iVar2,&local_30);
    iVar2._M_current =
         (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = leader;
    iVar2._M_current =
         (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
              ((vector<Character*,std::allocator<Character*>> *)&this->members,iVar2,&local_38);
    other = local_38;
  }
  else {
    *iVar2._M_current = other;
    pppCVar1 = &(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  this->leader = local_30;
  local_30->party = this;
  other->party = this;
  this->temp_expsum = 0;
  RefreshMembers(this,local_30,true);
  RefreshMembers(this,local_38,true);
  return;
}

Assistant:

Party::Party(World *world, Character *leader, Character *other)
{
	this->world = world;
	this->world->parties.push_back(this);

	this->members.push_back(leader);
	this->members.push_back(other);

	this->leader = leader;

	leader->party = this;
	other->party = this;

	this->temp_expsum = 0;

	this->RefreshMembers(leader, true);
	this->RefreshMembers(other, true);
}